

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O2

bool __thiscall spvtools::opt::LoopFusion::CheckCondition(LoopFusion *this)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  bool bVar3;
  uint32_t uVar4;
  Instruction *this_00;
  Instruction *this_01;
  DefUseManager *pDVar5;
  Instruction *pIVar6;
  Instruction *pIVar7;
  uint32_t i;
  uint32_t index;
  
  this_00 = Loop::GetConditionInst(this->loop_0_);
  this_01 = Loop::GetConditionInst(this->loop_1_);
  bVar3 = Loop::IsSupportedCondition(this->loop_0_,this_00->opcode_);
  if ((!bVar3) || (bVar3 = Loop::IsSupportedCondition(this->loop_1_,this_01->opcode_), !bVar3)) {
    return false;
  }
  index = 0;
  if (this_00->opcode_ != this_01->opcode_) {
    return false;
  }
  do {
    uVar4 = Instruction::NumInOperandWords(this_00);
    bVar3 = uVar4 <= index;
    if (bVar3) {
      return bVar3;
    }
    pDVar5 = IRContext::get_def_use_mgr(this->context_);
    uVar4 = Instruction::GetSingleWordInOperand(this_00,index);
    pIVar6 = analysis::DefUseManager::GetDef(pDVar5,uVar4);
    pDVar5 = IRContext::get_def_use_mgr(this->context_);
    uVar4 = Instruction::GetSingleWordInOperand(this_01,index);
    pIVar7 = analysis::DefUseManager::GetDef(pDVar5,uVar4);
    pIVar1 = this->induction_0_;
    pIVar2 = this->induction_1_;
    if ((pIVar6 != pIVar1) || (pIVar7 != pIVar2)) {
      if (pIVar6 != pIVar7) {
        return bVar3;
      }
      if (pIVar6 == pIVar1 && pIVar7 != pIVar2) {
        return bVar3;
      }
      if (pIVar6 != pIVar1 && pIVar7 == pIVar2) {
        return bVar3;
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

bool LoopFusion::CheckCondition() {
  auto condition_0 = loop_0_->GetConditionInst();
  auto condition_1 = loop_1_->GetConditionInst();

  if (!loop_0_->IsSupportedCondition(condition_0->opcode()) ||
      !loop_1_->IsSupportedCondition(condition_1->opcode())) {
    return false;
  }

  if (condition_0->opcode() != condition_1->opcode()) {
    return false;
  }

  for (uint32_t i = 0; i < condition_0->NumInOperandWords(); ++i) {
    auto arg_0 = context_->get_def_use_mgr()->GetDef(
        condition_0->GetSingleWordInOperand(i));
    auto arg_1 = context_->get_def_use_mgr()->GetDef(
        condition_1->GetSingleWordInOperand(i));

    if (arg_0 == induction_0_ && arg_1 == induction_1_) {
      continue;
    }

    if (arg_0 == induction_0_ && arg_1 != induction_1_) {
      return false;
    }

    if (arg_1 == induction_1_ && arg_0 != induction_0_) {
      return false;
    }

    if (arg_0 != arg_1) {
      return false;
    }
  }

  return true;
}